

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O0

void __thiscall
JsrtCallbackState::JsrtCallbackState(JsrtCallbackState *this,ThreadContext *currentThreadContext)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  JsrtContext *pJVar4;
  ScriptContext *this_00;
  ThreadContext *pTVar5;
  undefined4 *puVar6;
  ThreadContext *currentThreadContext_local;
  JsrtCallbackState *this_local;
  
  if (currentThreadContext == (ThreadContext *)0x0) {
    pTVar3 = ThreadContext::GetContextForCurrentThread();
    this->originalThreadContext = pTVar3;
  }
  else {
    this->originalThreadContext = currentThreadContext;
  }
  pJVar4 = JsrtContext::GetCurrent();
  this->originalJsrtContext = pJVar4;
  if (this->originalJsrtContext != (JsrtContext *)0x0) {
    pTVar3 = this->originalThreadContext;
    this_00 = JsrtContext::GetScriptContext(this->originalJsrtContext);
    pTVar5 = Js::ScriptContext::GetThreadContext(this_00);
    if (pTVar3 != pTVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtHelper.cpp"
                         ,0x36,
                         "(originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext())"
                         ,
                         "originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

JsrtCallbackState::JsrtCallbackState(ThreadContext* currentThreadContext)
{
    if (currentThreadContext == nullptr)
    {
        originalThreadContext = ThreadContext::GetContextForCurrentThread();
    }
    else
    {
        originalThreadContext = currentThreadContext;
    }
    originalJsrtContext = JsrtContext::GetCurrent();
    Assert(originalJsrtContext == nullptr || originalThreadContext == originalJsrtContext->GetScriptContext()->GetThreadContext());
}